

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,Address *address,Amount *value,
          ConfidentialAssetId *asset)

{
  uint32_t index;
  ByteData hash_data;
  Script locking_script;
  ConfidentialNonce local_a0;
  void *local_78 [3];
  Script local_60;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
             &(address->hash_).data_);
  core::Address::GetLockingScript(&local_60,address);
  core::ConfidentialNonce::ConfidentialNonce(&local_a0);
  index = core::ConfidentialTransaction::AddTxOut
                    (&this->transaction_,value,asset,&local_60,&local_a0);
  core::ConfidentialTransaction::GetTxOut(__return_storage_ptr__,&this->transaction_,index);
  local_a0._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
  if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&local_60);
  if (local_78[0] != (void *)0x0) {
    operator_delete(local_78[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const Address& address, const Amount& value,
    const ConfidentialAssetId& asset) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  return AddTxOut(locking_script, value, asset, ConfidentialNonce());
}